

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O1

Link * __thiscall Link::erase(Link *this)

{
  Link *pLVar1;
  
  pLVar1 = this->succ;
  if (pLVar1 != (Link *)0x0) {
    pLVar1->prev = this->prev;
  }
  if (this->prev != (Link *)0x0) {
    this->prev->succ = pLVar1;
  }
  return this->succ;
}

Assistant:

Link* Link::erase()
{
	if (!this)
		return nullptr;
	if (succ)
		succ->prev = prev;
	if (prev)
		prev->succ = succ;
	return succ;
}